

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# henson-chai.cpp
# Opt level: O2

void catch_sig(int signum)

{
  char **args;
  char cVar1;
  element_type *this;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  void *__ptr;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  char **args_1;
  long lVar11;
  format_string_t<int_&,_std::__cxx11::basic_string<char>_&,_std::__cxx11::basic_string<char>,_int>
  fmt;
  format_string_t<char_*&> fmt_00;
  format_string_t<char_*&,_char_*&,_char_*&> fmt_01;
  char *begin_offset;
  int signum_local;
  char *begin_name;
  char *funcname;
  int status;
  size_t funcnamesize;
  void *callstack [128];
  
  this = logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  signum_local = signum;
  henson::ProcMap::group_abi_cxx11_
            ((string *)callstack,
             proc_map.super___shared_ptr<henson::ProcMap,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  iVar4 = henson::ProcMap::local_rank
                    (proc_map.super___shared_ptr<henson::ProcMap,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    );
  funcnamesize = CONCAT44(funcnamesize._4_4_,iVar4);
  fmt.str_.size_ = 0x45;
  fmt.str_.data_ = "caught signal {}; active puppet {}; local group = {}, local rank = {}";
  spdlog::logger::critical<int&,std::__cxx11::string&,std::__cxx11::string,int>
            (this,fmt,&signum_local,&active_puppet_abi_cxx11_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)callstack,
             (int *)&funcnamesize);
  std::__cxx11::string::~string((string *)callstack);
  iVar4 = backtrace(callstack,0x80);
  __ptr = (void *)backtrace_symbols(callstack);
  funcnamesize = 0x100;
  funcname = (char *)malloc(0x100);
  lVar11 = 1;
  do {
    if (iVar4 <= lVar11) {
      free(funcname);
      free(__ptr);
      signal(signum_local,(__sighandler_t)0x0);
      if (abort_on_segfault_ != false) {
        MPI_Abort(&ompi_mpi_comm_world,1);
      }
      return;
    }
    begin_name = (char *)0x0;
    begin_offset = (char *)0x0;
    args = (char **)((long)__ptr + lVar11 * 8);
    pcVar5 = *(char **)((long)__ptr + lVar11 * 8);
    pcVar10 = (char *)0x0;
    pcVar7 = (char *)0x0;
LAB_0014639c:
    cVar1 = *pcVar5;
    pcVar6 = pcVar5;
    pcVar8 = pcVar7;
    pcVar2 = begin_offset;
    pcVar3 = pcVar5;
    if ((cVar1 == '(') ||
       (pcVar6 = pcVar10, pcVar8 = pcVar5, pcVar2 = pcVar5, pcVar3 = begin_name, cVar1 == '+')) {
LAB_001463d5:
      begin_name = pcVar3;
      begin_offset = pcVar2;
      pcVar5 = pcVar5 + 1;
      pcVar10 = pcVar6;
      pcVar7 = pcVar8;
      goto LAB_0014639c;
    }
    if (cVar1 != '\0') {
      pcVar8 = pcVar7;
      pcVar2 = begin_offset;
      if (cVar1 == ')' && pcVar7 != (char *)0x0) goto LAB_001463dc;
      goto LAB_001463d5;
    }
    pcVar5 = (char *)0x0;
LAB_001463dc:
    if (pcVar10 < pcVar7 &&
        (pcVar5 != (char *)0x0 && (pcVar7 != (char *)0x0 && pcVar10 != (char *)0x0))) {
      begin_name = pcVar10 + 1;
      *pcVar10 = '\0';
      *begin_offset = '\0';
      *pcVar5 = '\0';
      begin_offset = begin_offset + 1;
      pcVar5 = (char *)__cxa_demangle(begin_name,funcname,&funcnamesize,&status);
      if (status == 0) {
        pcVar10 = "  {} : {}+{}";
        sVar9 = 0xc;
        args_1 = &funcname;
        funcname = pcVar5;
      }
      else {
        pcVar10 = "  {} : {}()+{}";
        sVar9 = 0xe;
        args_1 = &begin_name;
      }
      fmt_01.str_.size_ = sVar9;
      fmt_01.str_.data_ = pcVar10;
      spdlog::logger::critical<char*&,char*&,char*&>
                (logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,fmt_01
                 ,args,args_1,&begin_offset);
    }
    else {
      fmt_00.str_.size_ = 4;
      fmt_00.str_.data_ = "  {}";
      spdlog::logger::critical<char*&>
                (logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,fmt_00
                 ,args);
    }
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

void catch_sig(int signum)
{
    logger->critical("caught signal {}; active puppet {}; local group = {}, local rank = {}",
                     signum, active_puppet, proc_map->group(), proc_map->local_rank());

    // print backtrace
    void*   callstack[128];
    int     frames      = backtrace(callstack, 128);
    char**  strs        = backtrace_symbols(callstack, frames);

    size_t funcnamesize = 256;
    char*  funcname     = (char*) malloc(funcnamesize);

    // iterate over the returned symbol lines. skip the first, it is the
    // address of this function.
    for (int i = 1; i < frames; i++)
    {
        char *begin_name = 0, *begin_offset = 0, *end_offset = 0;

        // find parentheses and +address offset surrounding the mangled name:
        // ./module(function+0x15c) [0x8048a6d]
        for (char *p = strs[i]; *p; ++p)
        {
            if (*p == '(')
                begin_name = p;
            else if (*p == '+')
                begin_offset = p;
            else if (*p == ')' && begin_offset)
            {
                end_offset = p;
                break;
            }
        }

        if (begin_name && begin_offset && end_offset && begin_name < begin_offset)
        {
            *begin_name++   = '\0';
            *begin_offset++ = '\0';
            *end_offset     = '\0';

            // mangled name is now in [begin_name, begin_offset) and caller
            // offset in [begin_offset, end_offset). now apply __cxa_demangle():

            int status;
            char* ret = abi::__cxa_demangle(begin_name, funcname, &funcnamesize, &status);
            if (status == 0)
            {
                funcname = ret; // use possibly realloc()-ed string
                logger->critical("  {} : {}+{}", strs[i], funcname, begin_offset);
            } else
            {
                // demangling failed. Output function name as a C function with no arguments.
                logger->critical("  {} : {}()+{}", strs[i], begin_name, begin_offset);
            }
        }
        else
        {
            // couldn't parse the line? print the whole line.
            logger->critical("  {}", strs[i]);
        }
    }

    free(funcname);
    free(strs);

    //for (int i = 0; i < frames; ++i)
    //    logger->critical("{}", strs[i]);

    signal(signum, SIG_DFL);    // restore the default signal
    if (abort_on_segfault_)
        MPI_Abort(MPI_COMM_WORLD, 1);
}